

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderInvarianceRule3Test::initTestIterations
          (TessellationShaderInvarianceRule3Test *this)

{
  pointer *pp_Var1;
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing _Var2;
  iterator __position;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer p_Var5;
  int iVar6;
  deUint32 err;
  undefined4 extraout_var;
  _tessellation_levels *levels;
  GLfloat aGVar7 [2];
  long lVar8;
  GLint gl_max_tess_gen_level_value;
  _test_iteration test;
  undefined1 local_78 [16];
  pointer local_68;
  _tessellation_primitive_mode _Stack_60;
  _tessellation_shader_vertex_spacing _Stack_5c;
  uint local_58;
  long local_48;
  long local_40;
  vector<glcts::TessellationShaderInvarianceRule3Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule3Test::_test_iteration>>
  *local_38;
  
  iVar6 = (*((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar6) + 0x868))
            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_glExtTokens.
             MAX_TESS_GEN_LEVEL);
  err = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x55e);
  local_38 = (vector<glcts::TessellationShaderInvarianceRule3Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule3Test::_test_iteration>>
              *)&this->m_test_iterations;
  local_48 = 0;
  do {
    primitive_mode = (&DAT_01ba8998)[local_48];
    lVar8 = 0;
    do {
      _Var2 = (&DAT_01ba89a4)[lVar8];
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                ((_tessellation_levels_set *)local_78,primitive_mode,0,
                 TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
      p_Var5 = local_68;
      uVar4 = local_78._8_8_;
      uVar3 = local_78._0_8_;
      local_40 = lVar8;
      for (aGVar7 = (GLfloat  [2])local_78._0_8_; aGVar7 != (GLfloat  [2])uVar4;
          aGVar7 = (GLfloat  [2])((long)aGVar7 + 0x18)) {
        local_58 = 0;
        local_78._0_8_ = *(undefined8 *)aGVar7;
        local_78._8_8_ = *(undefined8 *)((long)aGVar7 + 8);
        local_68 = *(pointer *)((long)aGVar7 + 0x10);
        _Stack_5c = _Var2;
        _Stack_60 = primitive_mode;
        __position._M_current =
             (this->m_test_iterations).
             super__Vector_base<glcts::TessellationShaderInvarianceRule3Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule3Test::_test_iteration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_test_iterations).
            super__Vector_base<glcts::TessellationShaderInvarianceRule3Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule3Test::_test_iteration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glcts::TessellationShaderInvarianceRule3Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule3Test::_test_iteration>>
          ::_M_realloc_insert<glcts::TessellationShaderInvarianceRule3Test::_test_iteration_const&>
                    (local_38,__position,(_test_iteration *)local_78);
        }
        else {
          (__position._M_current)->n_vertices = 0;
          *(pointer *)((__position._M_current)->outer_tess_levels + 2) = local_68;
          (__position._M_current)->primitive_mode = primitive_mode;
          (__position._M_current)->vertex_spacing = _Var2;
          *(undefined8 *)(__position._M_current)->inner_tess_levels = local_78._0_8_;
          *(undefined8 *)(__position._M_current)->outer_tess_levels = local_78._8_8_;
          pp_Var1 = &(this->m_test_iterations).
                     super__Vector_base<glcts::TessellationShaderInvarianceRule3Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule3Test::_test_iteration>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pp_Var1 = *pp_Var1 + 1;
        }
      }
      if ((GLfloat  [2])uVar3 != (GLfloat  [2])0x0) {
        operator_delete((void *)uVar3,(long)p_Var5 - uVar3);
      }
      lVar8 = local_40 + 1;
    } while (lVar8 != 3);
    local_48 = local_48 + 1;
  } while (local_48 != 3);
  return;
}

Assistant:

void TessellationShaderInvarianceRule3Test::initTestIterations()
{
	DE_ASSERT(m_test_iterations.size() == 0);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Iterate through all primitive and vertex spacing modes */
	_tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	_tessellation_shader_vertex_spacing vs_modes[] = { TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
													   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
													   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD };

	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);
	const unsigned int n_vs_modes		 = sizeof(vs_modes) / sizeof(vs_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
		{
			_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

			/* Retrieve inner/outer tessellation level combinations we want the tests to be run for */
			_tessellation_levels_set levels_set;

			levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
				primitive_mode, gl_max_tess_gen_level_value,
				TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

			/* Iterate through all configurations */
			for (_tessellation_levels_set_const_iterator levels_iterator = levels_set.begin();
				 levels_iterator != levels_set.end(); levels_iterator++)
			{
				const _tessellation_levels& levels = *levels_iterator;

				/* Create a test descriptor for all the parameters we now have */
				_test_iteration test;

				memcpy(test.inner_tess_levels, levels.inner, sizeof(test.inner_tess_levels));
				memcpy(test.outer_tess_levels, levels.outer, sizeof(test.outer_tess_levels));

				test.primitive_mode = primitive_mode;
				test.vertex_spacing = vs_mode;

				m_test_iterations.push_back(test);
			} /* for (all inner/outer tessellation levels) */
		}	 /* for (all vertex spacing modes) */
	}		  /* for (all primitive modes) */
}